

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O0

void __thiscall Imf_3_3::StdOFStream::StdOFStream(StdOFStream *this,char *fileName)

{
  byte bVar1;
  ofstream *poVar2;
  OStream *in_RSI;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  OStream::OStream(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR__StdOFStream_0395d608;
  poVar2 = anon_unknown_2::make_ofstream((char *)in_RSI);
  in_RDI[5] = poVar2;
  *(undefined1 *)(in_RDI + 6) = 1;
  bVar1 = std::ios::operator!((ios *)((long)in_RDI[5] + *(long *)(*(long *)in_RDI[5] + -0x18)));
  if ((bVar1 & 1) != 0) {
    if ((long *)in_RDI[5] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[5] + 8))();
    }
    Iex_3_3::throwErrnoExc();
  }
  return;
}

Assistant:

StdOFStream::StdOFStream (const char fileName[])
    : OPENEXR_IMF_INTERNAL_NAMESPACE::OStream (fileName)
    , _os (make_ofstream (fileName))
    , _deleteStream (true)
{
    if (!*_os)
    {
        delete _os;
        IEX_NAMESPACE::throwErrnoExc ();
    }
}